

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sortaddrinfo.c
# Opt level: O2

ares_status_t ares_sortaddrinfo(ares_channel_t *channel,ares_addrinfo_node *list_sentinel)

{
  ushort uVar1;
  sockaddr *addr;
  _func_int_ares_socket_t_sockaddr_ptr_ares_socklen_t_ptr_void_ptr *p_Var2;
  ares_addrinfo_node *paVar3;
  undefined4 uVar4;
  ares_conn_err_t aVar5;
  int iVar6;
  ares_addrinfo_node **ppaVar7;
  long *plVar8;
  size_t sVar9;
  ares_addrinfo_node *paVar10;
  ares_status_t aVar11;
  size_t size;
  ares_socklen_t addrlen;
  long lVar12;
  size_t __nmemb;
  long *p;
  ares_addrinfo_node **ppaVar13;
  bool bVar14;
  ares_socket_t sock;
  ares_channel_t *local_60;
  size_t local_58;
  ares_socklen_t local_4c;
  long *local_48;
  long local_40;
  ares_addrinfo_node **local_38;
  
  size = 0;
  __nmemb = 0;
  ppaVar13 = &list_sentinel->ai_next;
  for (ppaVar7 = ppaVar13; *ppaVar7 != (ares_addrinfo_node *)0x0; ppaVar7 = &(*ppaVar7)->ai_next) {
    __nmemb = __nmemb + 1;
    size = size + 0x30;
  }
  if (__nmemb == 0) {
    aVar11 = ARES_ENODATA;
  }
  else {
    local_60 = channel;
    plVar8 = (long *)ares_malloc(size);
    if (plVar8 == (long *)0x0) {
      aVar11 = ARES_ENOMEM;
    }
    else {
      local_48 = plVar8;
      local_40 = __nmemb - 1;
      local_38 = ppaVar13;
      for (sVar9 = 0; p = local_48, __nmemb != sVar9; sVar9 = sVar9 + 1) {
        paVar10 = *ppaVar13;
        if (paVar10 == (ares_addrinfo_node *)0x0) {
          __assert_fail("cur != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/c-ares[P]c-ares/src/lib/ares_sortaddrinfo.c"
                        ,0x1a7,
                        "ares_status_t ares_sortaddrinfo(ares_channel_t *, struct ares_addrinfo_node *)"
                       );
        }
        *plVar8 = (long)paVar10;
        plVar8[5] = sVar9;
        addr = paVar10->ai_addr;
        uVar1 = addr->sa_family;
        uVar4 = 0;
        addrlen = 0x10;
        if (uVar1 == 2) {
LAB_001161ab:
          local_58 = sVar9;
          local_4c = addrlen;
          aVar5 = ares_socket_open(&sock,local_60,(uint)uVar1,2,0x11);
          if (aVar5 != ARES_CONN_ERR_AFNOSUPPORT) {
            if (aVar5 == ARES_CONN_ERR_SUCCESS) {
              aVar5 = ares_socket_connect(local_60,sock,ARES_FALSE,addr,addrlen);
              if (ARES_CONN_ERR_WOULDBLOCK < aVar5) {
                ares_socket_close(local_60,sock);
                goto LAB_00116200;
              }
              p_Var2 = (local_60->sock_funcs).agetsockname;
              if ((p_Var2 != (_func_int_ares_socket_t_sockaddr_ptr_ares_socklen_t_ptr_void_ptr *)0x0
                  ) && (iVar6 = (*p_Var2)(sock,(sockaddr *)((long)plVar8 + 0xc),&local_4c,
                                          local_60->sock_func_cb_data), iVar6 == 0)) {
                ares_socket_close(local_60,sock);
                uVar4 = 1;
                sVar9 = local_58;
                goto LAB_00116256;
              }
              ares_socket_close(local_60,sock);
            }
            aVar11 = ARES_ENOTFOUND;
            p = local_48;
            goto LAB_001162d9;
          }
LAB_00116200:
          uVar4 = 0;
          sVar9 = local_58;
        }
        else if (uVar1 == 10) {
          addrlen = 0x1c;
          goto LAB_001161ab;
        }
LAB_00116256:
        *(undefined4 *)(plVar8 + 1) = uVar4;
        ppaVar13 = &paVar10->ai_next;
        plVar8 = plVar8 + 6;
      }
      qsort(local_48,__nmemb,0x30,rfc6724_compare);
      paVar10 = (ares_addrinfo_node *)*p;
      *local_38 = paVar10;
      lVar12 = local_40;
      plVar8 = p;
      while( true ) {
        plVar8 = plVar8 + 6;
        bVar14 = lVar12 == 0;
        lVar12 = lVar12 + -1;
        if (bVar14) break;
        paVar3 = (ares_addrinfo_node *)*plVar8;
        paVar10->ai_next = paVar3;
        paVar10 = paVar3;
      }
      *(undefined8 *)(*(long *)((long)p + (size - 0x30)) + 0x20) = 0;
      aVar11 = ARES_SUCCESS;
LAB_001162d9:
      ares_free(p);
    }
  }
  return aVar11;
}

Assistant:

ares_status_t ares_sortaddrinfo(ares_channel_t            *channel,
                                struct ares_addrinfo_node *list_sentinel)
{
  struct ares_addrinfo_node *cur;
  size_t                     nelem = 0;
  size_t                     i;
  int                        has_src_addr;
  struct addrinfo_sort_elem *elems;

  cur = list_sentinel->ai_next;
  while (cur) {
    ++nelem;
    cur = cur->ai_next;
  }

  if (!nelem) {
    return ARES_ENODATA;
  }

  elems = (struct addrinfo_sort_elem *)ares_malloc(
    nelem * sizeof(struct addrinfo_sort_elem));
  if (!elems) {
    return ARES_ENOMEM;
  }

  /*
   * Convert the linked list to an array that also contains the candidate
   * source address for each destination address.
   */
  for (i = 0, cur = list_sentinel->ai_next; i < nelem;
       ++i, cur   = cur->ai_next) {
    assert(cur != NULL);
    elems[i].ai             = cur;
    elems[i].original_order = i;
    has_src_addr = find_src_addr(channel, cur->ai_addr, &elems[i].src_addr.sa);
    if (has_src_addr == -1) {
      ares_free(elems);
      return ARES_ENOTFOUND;
    }
    elems[i].has_src_addr = (has_src_addr == 1) ? ARES_TRUE : ARES_FALSE;
  }

  /* Sort the addresses, and rearrange the linked list so it matches the sorted
   * order. */
  qsort((void *)elems, nelem, sizeof(struct addrinfo_sort_elem),
        rfc6724_compare);

  list_sentinel->ai_next = elems[0].ai;
  for (i = 0; i < nelem - 1; ++i) {
    elems[i].ai->ai_next = elems[i + 1].ai;
  }
  elems[nelem - 1].ai->ai_next = NULL;

  ares_free(elems);
  return ARES_SUCCESS;
}